

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void build_rgb_y_table(j_decompress_ptr cinfo)

{
  jpeg_color_deconverter *pjVar1;
  _func_void_j_decompress_ptr *p_Var2;
  code *pcVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  
  pjVar1 = cinfo->cconvert;
  p_Var2 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x1800);
  pjVar1[3].start_pass = p_Var2;
  pcVar3 = p_Var2 + 0x1000;
  puVar4 = (undefined1 *)0x8000;
  puVar5 = (undefined1 *)0x0;
  puVar6 = (undefined1 *)0x0;
  do {
    *(undefined1 **)(pcVar3 + -0x1000) = puVar5;
    *(undefined1 **)(pcVar3 + -0x800) = puVar6;
    *(undefined1 **)pcVar3 = puVar4;
    puVar4 = &F_0_114 + (long)puVar4;
    puVar6 = &F_0_587 + (long)puVar6;
    pcVar3 = pcVar3 + 8;
    puVar5 = &F_0_299 + (long)puVar5;
  } while (puVar4 != (undefined1 *)0x1daf00);
  return;
}

Assistant:

LOCAL(void)
build_rgb_y_table(j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr)cinfo->cconvert;
  JLONG *rgb_y_tab;
  JLONG i;

  /* Allocate and fill in the conversion tables. */
  cconvert->rgb_y_tab = rgb_y_tab = (JLONG *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (TABLE_SIZE * sizeof(JLONG)));

  for (i = 0; i <= MAXJSAMPLE; i++) {
    rgb_y_tab[i + R_Y_OFF] = FIX(0.29900) * i;
    rgb_y_tab[i + G_Y_OFF] = FIX(0.58700) * i;
    rgb_y_tab[i + B_Y_OFF] = FIX(0.11400) * i + ONE_HALF;
  }
}